

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O3

Reals __thiscall
Omega_h::coarsen_qualities_tmpl<3,3>
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Read<signed_char> *pRVar3;
  Alloc *pAVar4;
  int n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  LO size_in;
  undefined8 uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  Reals RVar13;
  Write<double> qualities;
  Reals out;
  LOs cv2v;
  LOs ev2v;
  type f;
  Read<signed_char> vc_codes;
  LOs vc2c;
  LOs v2vc;
  MetricElementQualities<3,_3> measure;
  Write<signed_char> is_bad_w;
  Reals coords;
  Adj v2c;
  Write<double> local_200;
  Mesh *local_1f0;
  LOs local_1e8;
  Alloc *local_1d8;
  void *local_1d0;
  Write<double> local_1c8;
  Read<signed_char> local_1b8;
  Alloc *local_1a8;
  element_type *local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  element_type *local_190;
  type local_188;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  element_type *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  element_type *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  element_type *local_a8;
  MetricElementQualities<3,_3> local_a0;
  Write<signed_char> local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  Adj local_60;
  
  if ((uint)mesh->dim_ < 4) {
    if (mesh->dim_ == 3) {
      MetricElementQualities<3,_3>::MetricElementQualities(&local_a0,mesh);
      Mesh::ask_verts_of((Mesh *)&local_198,(Int)mesh);
      Mesh::ask_elem_verts((Mesh *)&local_1a8);
      Mesh::ask_up(&local_60,mesh,0,3);
      local_b0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
      if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_b0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                   _vptr__Sp_counted_base =
               *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                        _vptr__Sp_counted_base + 1;
        }
      }
      this_02._M_pi = local_b0._M_pi;
      local_a8 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
      local_c0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
      if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_c0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                   _vptr__Sp_counted_base =
               *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                        _vptr__Sp_counted_base + 1;
        }
      }
      this_01._M_pi = local_c0._M_pi;
      local_b8 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
      local_d0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.codes.write_.shared_alloc_.alloc
      ;
      if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_d0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)(local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base
               = *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->
                          _vptr__Sp_counted_base + 1;
        }
      }
      this_00._M_pi = local_d0._M_pi;
      local_c8 = (element_type *)local_60.codes.write_.shared_alloc_.direct_ptr;
      pAVar4 = (cands2edges->write_).shared_alloc_.alloc;
      local_d8 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
      local_e0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
      local_e8 = (element_type *)local_60.codes.write_.shared_alloc_.direct_ptr;
      if (((ulong)pAVar4 & 1) == 0) {
        sVar8 = pAVar4->size;
      }
      else {
        sVar8 = (ulong)pAVar4 >> 3;
      }
      pRVar3 = &local_188.cand_codes;
      local_188.cands2edges.write_.shared_alloc_.alloc = (Alloc *)pRVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"");
      n = (int)(sVar8 >> 2);
      Write<double>::Write(&local_200,n * 2,-1.0,(string *)&local_188);
      if (local_188.cands2edges.write_.shared_alloc_.alloc != (Alloc *)pRVar3) {
        operator_delete(local_188.cands2edges.write_.shared_alloc_.alloc,
                        (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                         *)&(local_188.cand_codes.write_.shared_alloc_.alloc)->size)
                                       ->_M_ptr + 1));
      }
      Mesh::coords((Mesh *)&local_70);
      size_in = Mesh::nelems(mesh);
      local_188.cands2edges.write_.shared_alloc_.alloc = (Alloc *)pRVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"");
      Write<signed_char>::Write(&local_80,size_in,'\0',(string *)&local_188);
      if (local_188.cands2edges.write_.shared_alloc_.alloc != (Alloc *)pRVar3) {
        operator_delete(local_188.cands2edges.write_.shared_alloc_.alloc,
                        (ulong)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                         *)&(local_188.cand_codes.write_.shared_alloc_.alloc)->size)
                                       ->_M_ptr + 1));
      }
      local_188.cands2edges.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
      if (((ulong)local_188.cands2edges.write_.shared_alloc_.alloc & 7) == 0 &&
          local_188.cands2edges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_188.cands2edges.write_.shared_alloc_.alloc =
               (Alloc *)((local_188.cands2edges.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_188.cands2edges.write_.shared_alloc_.alloc)->use_count =
               (local_188.cands2edges.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_188.cands2edges.write_.shared_alloc_.direct_ptr =
           (cands2edges->write_).shared_alloc_.direct_ptr;
      local_188.cand_codes.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
      if (((ulong)local_188.cand_codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_188.cand_codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_188.cand_codes.write_.shared_alloc_.alloc =
               (Alloc *)((local_188.cand_codes.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_188.cand_codes.write_.shared_alloc_.alloc)->use_count =
               (local_188.cand_codes.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_188.cand_codes.write_.shared_alloc_.direct_ptr =
           (cand_codes->write_).shared_alloc_.direct_ptr;
      local_188.ev2v.write_.shared_alloc_.alloc = (Alloc *)local_198._M_pi;
      if (((ulong)local_198._M_pi & 7) == 0 && (Alloc *)local_198._M_pi != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_188.ev2v.write_.shared_alloc_.alloc =
               (Alloc *)((long)(local_198._M_pi)->_vptr__Sp_counted_base * 8 + 1);
        }
        else {
          *(int *)&local_198._M_pi[3]._vptr__Sp_counted_base =
               *(int *)&local_198._M_pi[3]._vptr__Sp_counted_base + 1;
        }
      }
      local_188.ev2v.write_.shared_alloc_.direct_ptr = local_190;
      bVar10 = ((ulong)this_02._M_pi & 7) == 0;
      local_188.v2vc.write_.shared_alloc_.alloc = (Alloc *)this_02._M_pi;
      if (bVar10 && (Alloc *)this_02._M_pi != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_188.v2vc.write_.shared_alloc_.alloc =
               (Alloc *)((long)(this_02._M_pi)->_vptr__Sp_counted_base * 8 + 1);
        }
        else {
          *(int *)&this_02._M_pi[3]._vptr__Sp_counted_base =
               *(int *)&this_02._M_pi[3]._vptr__Sp_counted_base + 1;
        }
      }
      local_188.v2vc.write_.shared_alloc_.direct_ptr = local_d8;
      local_188.vc2c.write_.shared_alloc_.alloc = (Alloc *)this_01._M_pi;
      bVar11 = ((ulong)this_01._M_pi & 7) == 0;
      if (bVar11 && (Alloc *)this_01._M_pi != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_188.vc2c.write_.shared_alloc_.alloc =
               (Alloc *)((long)(this_01._M_pi)->_vptr__Sp_counted_base * 8 + 1);
        }
        else {
          *(int *)&this_01._M_pi[3]._vptr__Sp_counted_base =
               *(int *)&this_01._M_pi[3]._vptr__Sp_counted_base + 1;
        }
      }
      local_188.vc2c.write_.shared_alloc_.direct_ptr = local_e0._M_pi;
      local_188.vc_codes.write_.shared_alloc_.alloc = (Alloc *)this_00._M_pi;
      bVar12 = ((ulong)this_00._M_pi & 7) == 0;
      if (bVar12 && (Alloc *)this_00._M_pi != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_188.vc_codes.write_.shared_alloc_.alloc =
               (Alloc *)((long)(this_00._M_pi)->_vptr__Sp_counted_base * 8 + 1);
        }
        else {
          *(int *)&this_00._M_pi[3]._vptr__Sp_counted_base =
               *(int *)&this_00._M_pi[3]._vptr__Sp_counted_base + 1;
        }
      }
      local_188.vc_codes.write_.shared_alloc_.direct_ptr = local_e8;
      local_188.cv2v.write_.shared_alloc_.alloc = local_1a8;
      if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_188.cv2v.write_.shared_alloc_.alloc = (Alloc *)(local_1a8->size * 8 + 1);
        }
        else {
          local_1a8->use_count = local_1a8->use_count + 1;
        }
      }
      local_188.cv2v.write_.shared_alloc_.direct_ptr = local_1a0;
      local_188.measure.coords.write_.shared_alloc_.alloc =
           local_a0.coords.write_.shared_alloc_.alloc;
      if (((ulong)local_a0.coords.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a0.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_188.measure.coords.write_.shared_alloc_.alloc =
               (Alloc *)((long)(local_a0.coords.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)local_a0.coords.write_.shared_alloc_.alloc + 0x30))->
                   _vptr__Sp_counted_base =
               *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)local_a0.coords.write_.shared_alloc_.alloc + 0x30))->
                        _vptr__Sp_counted_base + 1;
        }
      }
      local_188.measure.coords.write_.shared_alloc_.direct_ptr =
           local_a0.coords.write_.shared_alloc_.direct_ptr;
      local_188.measure.metrics.write_.shared_alloc_.alloc =
           local_a0.metrics.write_.shared_alloc_.alloc;
      if (((ulong)local_a0.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a0.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_188.measure.metrics.write_.shared_alloc_.alloc =
               (Alloc *)((long)(local_a0.metrics.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)local_a0.metrics.write_.shared_alloc_.alloc + 0x30))->
                   _vptr__Sp_counted_base =
               *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)local_a0.metrics.write_.shared_alloc_.alloc + 0x30))->
                        _vptr__Sp_counted_base + 1;
        }
      }
      local_188.measure.metrics.write_.shared_alloc_.direct_ptr =
           local_a0.metrics.write_.shared_alloc_.direct_ptr;
      local_188.qualities.shared_alloc_.alloc = local_200.shared_alloc_.alloc;
      if (((ulong)local_200.shared_alloc_.alloc & 7) == 0 &&
          local_200.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_188.qualities.shared_alloc_.alloc =
               (Alloc *)((local_200.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_200.shared_alloc_.alloc)->use_count =
               (local_200.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_188.qualities.shared_alloc_.direct_ptr = local_200.shared_alloc_.direct_ptr;
      local_1f0 = (Mesh *)this;
      parallel_for<Omega_h::coarsen_qualities_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
                (n,&local_188,"coarsen_qualities");
      local_1c8.shared_alloc_.alloc = local_200.shared_alloc_.alloc;
      if (((ulong)local_200.shared_alloc_.alloc & 7) == 0 &&
          local_200.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1c8.shared_alloc_.alloc = (Alloc *)((local_200.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_200.shared_alloc_.alloc)->use_count =
               (local_200.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_1c8.shared_alloc_.direct_ptr = local_200.shared_alloc_.direct_ptr;
      Read<double>::Read(&local_1b8,&local_1c8);
      pAVar4 = local_1c8.shared_alloc_.alloc;
      if (((ulong)local_1c8.shared_alloc_.alloc & 7) == 0 &&
          local_1c8.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_1c8.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_1c8.shared_alloc_.alloc);
          operator_delete(pAVar4,0x48);
        }
      }
      local_1e8.write_.shared_alloc_.alloc = local_1b8.write_.shared_alloc_.alloc;
      if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_1b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1e8.write_.shared_alloc_.alloc =
               (Alloc *)((local_1b8.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_1b8.write_.shared_alloc_.alloc)->use_count =
               (local_1b8.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_1e8.write_.shared_alloc_.direct_ptr = local_1b8.write_.shared_alloc_.direct_ptr;
      local_1d8 = (cands2edges->write_).shared_alloc_.alloc;
      if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1d8 = (Alloc *)(local_1d8->size * 8 + 1);
        }
        else {
          local_1d8->use_count = local_1d8->use_count + 1;
        }
      }
      local_1d0 = (cands2edges->write_).shared_alloc_.direct_ptr;
      Mesh::sync_subset_array<double>
                (local_1f0,(Int)mesh,(Read<double> *)0x1,&local_1e8,-1.0,(Int)&local_1d8);
      pAVar4 = local_1d8;
      if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (Alloc *)0x0) {
        piVar1 = &local_1d8->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_1d8);
          operator_delete(pAVar4,0x48);
        }
      }
      pAVar4 = local_1e8.write_.shared_alloc_.alloc;
      if (((ulong)local_1e8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_1e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_1e8.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_1e8.write_.shared_alloc_.alloc);
          operator_delete(pAVar4,0x48);
        }
      }
      if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_1b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_1b8.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_1b8.write_.shared_alloc_.alloc);
          operator_delete(local_1b8.write_.shared_alloc_.alloc,0x48);
        }
      }
      coarsen_qualities_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::
      {lambda(int)#1}::~Mesh((_lambda_int__1_ *)&local_188);
      if (((ulong)local_80.shared_alloc_.alloc & 7) == 0 &&
          local_80.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_80.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_80.shared_alloc_.alloc);
          operator_delete(local_80.shared_alloc_.alloc,0x48);
        }
      }
      if (((ulong)local_70._M_pi & 7) == 0 && (Alloc *)local_70._M_pi != (Alloc *)0x0) {
        p_Var2 = local_70._M_pi + 3;
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_70._M_pi);
          operator_delete(local_70._M_pi,0x48);
        }
      }
      if (((ulong)local_200.shared_alloc_.alloc & 7) == 0 &&
          local_200.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_200.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_200.shared_alloc_.alloc);
          operator_delete(local_200.shared_alloc_.alloc,0x48);
        }
      }
      if (bVar12 && (Alloc *)this_00._M_pi != (Alloc *)0x0) {
        p_Var2 = this_00._M_pi + 3;
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)this_00._M_pi);
          operator_delete(this_00._M_pi,0x48);
        }
      }
      if (bVar11 && (Alloc *)this_01._M_pi != (Alloc *)0x0) {
        p_Var2 = this_01._M_pi + 3;
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)this_01._M_pi);
          operator_delete(this_01._M_pi,0x48);
        }
      }
      if (bVar10 && (Alloc *)this_02._M_pi != (Alloc *)0x0) {
        p_Var2 = this_02._M_pi + 3;
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)this_02._M_pi);
          operator_delete(this_02._M_pi,0x48);
        }
      }
      Adj::~Adj(&local_60);
      pvVar6 = extraout_RDX;
      if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
        piVar1 = &local_1a8->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_1a8);
          operator_delete(local_1a8,0x48);
          pvVar6 = extraout_RDX_00;
        }
      }
      if (((ulong)local_198._M_pi & 7) == 0 && (Alloc *)local_198._M_pi != (Alloc *)0x0) {
        p_Var2 = local_198._M_pi + 3;
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_198._M_pi);
          operator_delete(local_198._M_pi,0x48);
          pvVar6 = extraout_RDX_01;
        }
      }
      if (((ulong)local_a0.metrics.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a0.metrics.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_a0.metrics.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_a0.metrics.write_.shared_alloc_.alloc);
          operator_delete(local_a0.metrics.write_.shared_alloc_.alloc,0x48);
          pvVar6 = extraout_RDX_02;
        }
      }
      if (((ulong)local_a0.coords.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a0.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_a0.coords.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_a0.coords.write_.shared_alloc_.alloc);
          operator_delete(local_a0.coords.write_.shared_alloc_.alloc,0x48);
          pvVar6 = extraout_RDX_03;
        }
      }
      RVar13.write_.shared_alloc_.direct_ptr = pvVar6;
      RVar13.write_.shared_alloc_.alloc = (Alloc *)local_1f0;
      return (Reals)RVar13.write_.shared_alloc_;
    }
    pcVar9 = "mesh->dim() == mesh_dim";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_qualities.cpp"
    ;
    uVar5 = 0x12;
  }
  else {
    pcVar9 = "0 <= dim_ && dim_ <= 3";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    uVar5 = 0x33;
  }
  fail("assertion %s failed at %s +%d\n",pcVar9,pcVar7,uVar5);
}

Assistant:

Reals coarsen_qualities_tmpl(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->dim() == mesh_dim);
  MetricElementQualities<mesh_dim, metric_dim> measure(mesh);
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto cv2v = mesh->ask_elem_verts();
  auto v2c = mesh->ask_up(VERT, mesh_dim);
  auto v2vc = v2c.a2ab;
  auto vc2c = v2c.ab2b;
  auto vc_codes = v2c.codes;
  auto ncands = cands2edges.size();
  auto qualities = Write<Real>(ncands * 2, -1.0);
  auto coords = mesh->coords();
  auto is_bad_w = Write<Byte>(mesh->nelems(), Byte(0));
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = cands2edges[cand];
    auto code = cand_codes[cand];
    for (Int eev_col = 0; eev_col < 2; ++eev_col) {
      if (!collapses(code, eev_col)) continue;
      auto v_col = ev2v[e * 2 + eev_col];
      auto eev_onto = 1 - eev_col;
      auto v_onto = ev2v[e * 2 + eev_onto];
      Real minqual = 1.0;
      for (auto vc = v2vc[v_col]; vc < v2vc[v_col + 1]; ++vc) {
        auto c = vc2c[vc];
        auto vc_code = vc_codes[vc];
        auto ccv_col = code_which_down(vc_code);
        auto ccv2v = gather_verts<mesh_dim + 1>(cv2v, c);
        bool will_die = false;
        for (auto ccv = 0; ccv < (mesh_dim + 1); ++ccv) {
          if ((ccv != ccv_col) && (ccv2v[ccv] == v_onto)) {
            will_die = true;
            break;
          }
        }
        if (will_die) continue;
        OMEGA_H_CHECK(0 <= ccv_col && ccv_col < mesh_dim + 1);
        ccv2v[ccv_col] = v_onto;  // vertices of new cell
        auto qual = measure.measure(ccv2v);
        minqual = min2(minqual, qual);
      }
      qualities[cand * 2 + eev_col] = minqual;
    }
  };
  parallel_for(ncands, f, "coarsen_qualities");
  auto out = Reals(qualities);
  return mesh->sync_subset_array(EDGE, out, cands2edges, -1.0, 2);
}